

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

void __thiscall
FOptionMenuSliderBase::DrawSlider
          (FOptionMenuSliderBase *this,int x,int y,double min,double max,double cur,int fracdigits,
          int indent)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double ccur;
  int local_58;
  int cy;
  int right;
  int maxlen;
  double range;
  char textbuf [16];
  int indent_local;
  int fracdigits_local;
  double cur_local;
  double max_local;
  double min_local;
  int y_local;
  int x_local;
  FOptionMenuSliderBase *this_local;
  
  cy = 0;
  local_58 = x + CleanXfac_1 * 100;
  iVar1 = y + (OptionSettings.mLinespacing + -8) * CleanYfac_1;
  textbuf._8_4_ = indent;
  textbuf._12_4_ = fracdigits;
  dVar3 = clamp<double>(cur,min,max);
  if (-1 < (int)textbuf._12_4_) {
    mysnprintf((char *)&range,0x10,"%.*f",max,(ulong)(uint)textbuf._12_4_);
    iVar2 = FFont::StringWidth(SmallFont,(char *)&range);
    cy = iVar2 * CleanXfac_1;
  }
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  this->mSliderShort = (uint)(iVar2 < local_58 + cy);
  if (this->mSliderShort == 0) {
    M_DrawConText(9,x,iVar1,"\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12");
    M_DrawConText(8,x + (int)((((dVar3 - min) * 78.0) / (max - min) + 5.0) * (double)CleanXfac_1),
                  iVar1,"\x13");
  }
  else {
    M_DrawConText(9,x,iVar1,"\x10\x11\x11\x11\x11\x11\x12");
    M_DrawConText(8,x + (int)((((dVar3 - min) * 38.0) / (max - min) + 5.0) * (double)CleanXfac_1),
                  iVar1,"\x13");
    local_58 = local_58 + CleanXfac_1 * -0x28;
  }
  if (-1 < (int)textbuf._12_4_) {
    iVar1 = DCanvas::GetWidth((DCanvas *)screen);
    if (local_58 + cy <= iVar1) {
      mysnprintf((char *)&range,0x10,"%.*f",cur,(ulong)(uint)textbuf._12_4_);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,0x14,local_58,y,(char *)&range,0x40001394,1,0);
    }
  }
  return;
}

Assistant:

void DrawSlider (int x, int y, double min, double max, double cur, int fracdigits, int indent)
	{
		char textbuf[16];
		double range;
		int maxlen = 0;
		int right = x + (12*8 + 4) * CleanXfac_1;
		int cy = y + (OptionSettings.mLinespacing-8)*CleanYfac_1;

		range = max - min;
		double ccur = clamp(cur, min, max) - min;

		if (fracdigits >= 0)
		{
			mysnprintf(textbuf, countof(textbuf), "%.*f", fracdigits, max);
			maxlen = SmallFont->StringWidth(textbuf) * CleanXfac_1;
		}

		mSliderShort = right + maxlen > screen->GetWidth();

		if (!mSliderShort)
		{
			M_DrawConText(CR_WHITE, x, cy, "\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12");
			M_DrawConText(CR_ORANGE, x + int((5 + ((ccur * 78) / range)) * CleanXfac_1), cy, "\x13");
		}
		else
		{
			// On 320x200 we need a shorter slider
			M_DrawConText(CR_WHITE, x, cy, "\x10\x11\x11\x11\x11\x11\x12");
			M_DrawConText(CR_ORANGE, x + int((5 + ((ccur * 38) / range)) * CleanXfac_1), cy, "\x13");
			right -= 5*8*CleanXfac_1;
		}

		if (fracdigits >= 0 && right + maxlen <= screen->GetWidth())
		{
			mysnprintf(textbuf, countof(textbuf), "%.*f", fracdigits, cur);
			screen->DrawText(SmallFont, CR_DARKGRAY, right, y, textbuf, DTA_CleanNoMove_1, true, TAG_DONE);
		}
	}